

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcondensedcompel.cpp
# Opt level: O1

void __thiscall TPZCondensedCompEl::Assemble(TPZCondensedCompEl *this)

{
  TPZMatRed<double,_TPZFMatrix<double>_> *this_00;
  double dVar1;
  int64_t iVar2;
  int iVar3;
  undefined4 extraout_var;
  int64_t j;
  long lVar4;
  long lVar5;
  TPZElementMatrixT<double> ek;
  TPZElementMatrixT<double> ef;
  TPZElementMatrixT<double> local_86b0;
  TPZElementMatrixT<double> local_4370;
  
  local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)(this->fCondensed).fK00.fRef;
  LOCK();
  (((TPZReference *)local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix)->fCounter).
  super___atomic_base<int>._M_i =
       (((TPZReference *)local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix)->fCounter).
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (*(((TPZReference *)local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix)->fPointer->
    super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xe])
            (((TPZReference *)local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix)->fPointer,
             this->fNumInternalEqs);
  this_00 = &this->fCondensed;
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)&local_86b0);
  TPZMatRed<double,_TPZFMatrix<double>_>::Redim(this_00,this->fNumTotalEqs,this->fNumInternalEqs);
  TPZMatRed<double,_TPZFMatrix<double>_>::Zero(this_00);
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_86b0);
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_4370);
  (**(code **)(*(long *)this->fReferenceCompEl + 0x108))
            (this->fReferenceCompEl,&local_86b0,&local_4370);
  TPZElementMatrixT<double>::PermuteGather(&local_86b0,&(this->fIndexes).super_TPZVec<long>);
  TPZElementMatrixT<double>::PermuteGather(&local_4370,&(this->fIndexes).super_TPZVec<long>);
  iVar2 = local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
  if (0 < local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow)
  {
    lVar5 = 0;
    do {
      lVar4 = 0;
      do {
        if ((local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
             fRow <= lVar5) ||
           (local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            fCol <= lVar4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar1 = local_86b0.fMat.super_TPZFMatrix<double>.fElem
                [local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fRow * lVar4 + lVar5];
        if (((this->fCondensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
           ((this->fCondensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZMatrix<double>::Error("TPZMatrix<TVar>::Operator()","Index out of range");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                     ,0x33d);
        }
        iVar3 = (*(this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x22])(this_00,lVar5,lVar4);
        *(double *)CONCAT44(extraout_var,iVar3) = dVar1;
        lVar4 = lVar4 + 1;
      } while (iVar2 != lVar4);
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar2);
  }
  TPZMatRed<double,_TPZFMatrix<double>_>::SetF(this_00,&local_4370.fMat.super_TPZFMatrix<double>);
  iVar2 = (this->fCondensed).fDim1;
  (this->fCondensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = iVar2;
  (this->fCondensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = iVar2;
  (this->fCondensed).fIsReduced = true;
  local_4370.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_4370.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_4370.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_4370.super_TPZElementMatrix);
  local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_86b0.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_86b0.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_86b0.super_TPZElementMatrix);
  return;
}

Assistant:

void TPZCondensedCompEl::Assemble()
{
    fCondensed.K00()->Redim(fNumInternalEqs, fNumInternalEqs);
    fCondensed.Redim(fNumTotalEqs, fNumInternalEqs);

    fCondensed.Zero();
    //TODOCOMPLEX
    TPZElementMatrixT<STATE> ek,ef;
    
    fReferenceCompEl->CalcStiff(ek,ef);
    ek.PermuteGather(fIndexes);
    ef.PermuteGather(fIndexes);

    int64_t dim = ek.fMat.Rows();
    for (int64_t i=0; i<dim ; ++i) {
        for (int64_t j=0; j<dim ; ++j) {
            fCondensed(i,j) = ek.fMat(i,j);
        }
    }
    
    fCondensed.SetF(ef.fMat);
    fCondensed.SetReduced();
}